

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O2

tommy_tree_node *
tommy_tree_remove_node
          (tommy_compare_func *cmp,tommy_tree_node *root,void *data,tommy_tree_node **let)

{
  long lVar1;
  int iVar2;
  tommy_tree_node *ptVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (root == (tommy_tree_node *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (tommy_tree_node *)0x0;
    }
  }
  else {
    iVar2 = (*cmp)(data,root->data);
    if (iVar2 < 0) {
      ptVar3 = tommy_tree_remove_node(cmp,root->prev,data,let);
      root->prev = ptVar3;
    }
    else {
      if (iVar2 == 0) {
        *let = root;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          ptVar3 = tommy_tree_move_right(root->prev,root->next);
          return ptVar3;
        }
        goto LAB_0010f06c;
      }
      ptVar3 = tommy_tree_remove_node(cmp,root->next,data,let);
      root->next = ptVar3;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      ptVar3 = tommy_tree_balance(root);
      return ptVar3;
    }
  }
LAB_0010f06c:
  __stack_chk_fail();
}

Assistant:

static tommy_tree_node* tommy_tree_remove_node(tommy_compare_func* cmp, tommy_tree_node* root, void* data, tommy_tree_node** let)
{
	int c;

	if (!root)
		return 0;

	c = cmp(data, root->data);

	if (c < 0) {
		root->prev = tommy_tree_remove_node(cmp, root->prev, data, let);
		return tommy_tree_balance(root);
	}

	if (c > 0) {
		root->next = tommy_tree_remove_node(cmp, root->next, data, let);
		return tommy_tree_balance(root);
	}

	/* found */
	*let = root;

	return tommy_tree_move_right(root->prev, root->next);
}